

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effects.cpp
# Opt level: O2

void __thiscall CEffects::SmokeTrail(CEffects *this,vec2 Pos,vec2 Vel)

{
  vec2 vVar1;
  long in_FS_OFFSET;
  float fVar2;
  float fVar3;
  anon_union_4_2_94730284_for_vector2_base<float>_1 local_78;
  anon_union_4_2_947302a4_for_vector2_base<float>_3 aStack_74;
  CParticle local_68;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->m_Add50hz == true) {
    local_68.m_Rot = 0.0;
    local_68.m_Rotspeed = 0.0;
    local_68.m_Color.field_3.w = 1.0;
    local_68.m_Spr = 5;
    local_68.m_FlowAffected = 1.0;
    local_68.m_Pos = Pos;
    vVar1 = RandomDir();
    local_78 = Vel.field_0;
    aStack_74 = Vel.field_1;
    local_68.m_Vel.field_1.y = vVar1.field_1.y * 50.0 + aStack_74.y;
    local_68.m_Vel.field_0.x = vVar1.field_0.x * 50.0 + local_78.x;
    fVar2 = random_float();
    fVar3 = random_float();
    local_68.m_StartSize = fVar3 * 8.0 + 12.0;
    local_68.m_LifeSpan = fVar2 * 0.5 + 0.5;
    local_68.m_EndSize = 0.0;
    local_68.m_Friction = 0.7;
    local_68.m_Color.field_0 = (anon_union_4_2_94730227_for_vector4_base<float>_1)0x3f800000;
    local_68.m_Color.field_1 = (anon_union_4_2_947300d3_for_vector4_base<float>_3)0x3f800000;
    local_68.m_Color.field_2 = (anon_union_4_2_94730039_for_vector4_base<float>_5)0x3f800000;
    local_68.m_Gravity = random_float();
    local_68.m_Gravity = local_68.m_Gravity * -500.0;
    CParticles::Add(((this->super_CComponent).m_pClient)->m_pParticles,0,&local_68);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CEffects::SmokeTrail(vec2 Pos, vec2 Vel)
{
	if(!m_Add50hz)
		return;

	CParticle p;
	p.SetDefault();
	p.m_Spr = SPRITE_PART_SMOKE;
	p.m_Pos = Pos;
	p.m_Vel = Vel + RandomDir()*50.0f;
	p.m_LifeSpan = 0.5f + random_float()*0.5f;
	p.m_StartSize = 12.0f + random_float()*8;
	p.m_EndSize = 0;
	p.m_Friction = 0.7f;
	p.m_Gravity = random_float()*-500.0f;
	m_pClient->m_pParticles->Add(CParticles::GROUP_PROJECTILE_TRAIL, &p);
}